

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Own<kj::DatagramReceiver,_std::nullptr_t> __thiscall
kj::anon_unknown_0::DatagramPortImpl::makeReceiver(DatagramPortImpl *this,Capacity capacity)

{
  DatagramReceiver *extraout_RDX;
  Own<kj::DatagramReceiver,_std::nullptr_t> OVar1;
  undefined1 local_38 [24];
  DatagramPortImpl *this_local;
  Capacity capacity_local;
  
  this_local = (DatagramPortImpl *)capacity.ancillary;
  local_38._16_8_ = capacity.content;
  capacity_local.ancillary = (size_t)this;
  heap<kj::(anonymous_namespace)::DatagramPortImpl::ReceiverImpl,kj::(anonymous_namespace)::DatagramPortImpl&,kj::DatagramReceiver::Capacity&>
            ((kj *)local_38,(DatagramPortImpl *)local_38._16_8_,(Capacity *)&this_local);
  Own<kj::DatagramReceiver,decltype(nullptr)>::
  Own<kj::(anonymous_namespace)::DatagramPortImpl::ReceiverImpl,void>
            ((Own<kj::DatagramReceiver,decltype(nullptr)> *)this,
             (Own<kj::(anonymous_namespace)::DatagramPortImpl::ReceiverImpl,_std::nullptr_t> *)
             local_38);
  Own<kj::(anonymous_namespace)::DatagramPortImpl::ReceiverImpl,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::DatagramPortImpl::ReceiverImpl,_std::nullptr_t> *)
             local_38);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<DatagramReceiver> DatagramPortImpl::makeReceiver(DatagramReceiver::Capacity capacity) {
  return kj::heap<ReceiverImpl>(*this, capacity);
}